

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O1

void m256v_mult_col_from(m256v *M,int c,int offs,uint8_t alpha)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000009;
  long lVar4;
  
  if ((int)CONCAT71(in_register_00000009,alpha) == 0) {
    if (offs < M->n_row) {
      lVar4 = (long)offs;
      do {
        M->e[(long)c + M->rstride * lVar4] = '\0';
        lVar4 = lVar4 + 1;
      } while (lVar4 < M->n_row);
    }
  }
  else {
    iVar2 = gf256_log(alpha);
    if (offs < M->n_row) {
      lVar4 = (long)offs;
      do {
        if (M->e[(long)c + M->rstride * lVar4] != '\0') {
          iVar3 = gf256_log(M->e[(long)c + M->rstride * lVar4]);
          uVar1 = gf256_exp(iVar3 + iVar2);
          M->e[(long)c + M->rstride * lVar4] = uVar1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < M->n_row);
    }
  }
  return;
}

Assistant:

void m256v_mult_col_from(m256v* M, int c, int offs, uint8_t alpha)
{
	if (alpha != 0) {
		const int log_alpha = flog(alpha);
		for (int j = offs; j < M->n_row; ++j) {
			uint8_t val = get_el(M, j, c);
			if (val != 0) {
				val = fexp(flog(val) + log_alpha);
				set_el(M, j, c, val);
			}
		}
	} else {
		for (int j = offs; j < M->n_row; ++j) {
			set_el(M, j, c, 0);
		}
	}
}